

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void kratos::change_port_bundle_struct(Generator *top)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>_>_>_>
  *old_mapping;
  undefined1 local_88 [8];
  PortBundleVisitor b_visitor;
  Generator *top_local;
  
  b_visitor.bundle_mapping_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)top;
  PortBundleVisitor::PortBundleVisitor((PortBundleVisitor *)local_88);
  IRVisitor::visit_generator_root
            ((IRVisitor *)local_88,
             (Generator *)b_visitor.bundle_mapping_._M_t._M_impl.super__Rb_tree_header._M_node_count
            );
  old_mapping = PortBundleVisitor::bundle_mapping_abi_cxx11_((PortBundleVisitor *)local_88);
  merge_bundle_mapping(old_mapping);
  PortBundleVisitor::~PortBundleVisitor((PortBundleVisitor *)local_88);
  return;
}

Assistant:

void change_port_bundle_struct(Generator* top) {
    // pass to extract all the bundles
    PortBundleVisitor b_visitor;
    // this cannot be parallelized if we don't use a lock
    b_visitor.visit_generator_root(top);
    merge_bundle_mapping(b_visitor.bundle_mapping());
}